

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PacketAllocator.cpp
# Opt level: O1

void __thiscall pktalloc::Allocator::fallbackFree(Allocator *this,uint8_t *ptr)

{
  if (0x1f < (ulong)ptr[-0x21]) {
    return;
  }
  free(ptr + ((ulong)ptr[-0x21] - 0x40));
  return;
}

Assistant:

static inline void SIMDSafeFree(void* ptr)
{
    if (!ptr) {
        return;
    }
    uint8_t* data = (uint8_t*)ptr;
    unsigned offset = data[-1];
    if (offset >= kAlignmentBytes) {
        PKTALLOC_DEBUG_BREAK(); // Should never happen
        return;
    }
    data -= kAlignmentBytes - offset;
    free(data);
}